

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall ON_Layer::PersistentVisibility(ON_Layer *this)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = ON_ModelComponent::IsHidden(&this->super_ON_ModelComponent);
  if ((bVar1) &&
     (bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent), bVar1)) {
    bVar2 = this->m_extension_bits & 6;
    if (bVar2 == 2) {
      return true;
    }
    if (bVar2 == 4) {
      return false;
    }
  }
  bVar1 = ON_ModelComponent::IsHidden(&this->super_ON_ModelComponent);
  return !bVar1;
}

Assistant:

bool ON_Layer::PersistentVisibility() const
{
  if ( !IsVisible() && ParentIdIsNotNil() )
  {
    switch ( 0x06 & m_extension_bits )
    {
    case 0x02:
      return true;
    case 0x04:
      return false;
    }
  }

  return IsVisible();
}